

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStreamComponent_GetAvailableFrames
                  (PaAlsaStreamComponent *self,unsigned_long *numFrames,int *xrunOccurred)

{
  int iVar1;
  int iVar2;
  pthread_t __thread1;
  char *errorText;
  unsigned_long uStack_30;
  int __pa_unsure_error_id;
  snd_pcm_sframes_t framesAvail;
  PaError result;
  int *xrunOccurred_local;
  unsigned_long *numFrames_local;
  PaAlsaStreamComponent *self_local;
  
  uStack_30 = (*alsa_snd_pcm_avail_update)(self->pcm);
  *xrunOccurred = 0;
  if (uStack_30 == 0xffffffffffffffe0) {
    *xrunOccurred = 1;
    uStack_30 = 0;
  }
  else {
    iVar1 = (int)uStack_30;
    if (iVar1 < 0) {
      __thread1 = pthread_self();
      iVar2 = pthread_equal(__thread1,paUnixMainThread);
      if (iVar2 != 0) {
        errorText = (*alsa_snd_strerror)(iVar1);
        PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,errorText);
      }
      PaUtil_DebugPrint(
                       "Expression \'framesAvail\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3620\n"
                       );
      return -9999;
    }
  }
  *numFrames = uStack_30;
  return 0;
}

Assistant:

static PaError PaAlsaStreamComponent_GetAvailableFrames( PaAlsaStreamComponent *self, unsigned long *numFrames, int *xrunOccurred )
{
    PaError result = paNoError;
    snd_pcm_sframes_t framesAvail = alsa_snd_pcm_avail_update( self->pcm );
    *xrunOccurred = 0;

    if( -EPIPE == framesAvail )
    {
        *xrunOccurred = 1;
        framesAvail = 0;
    }
    else
    {
        ENSURE_( framesAvail, paUnanticipatedHostError );
    }

    *numFrames = framesAvail;

error:
    return result;
}